

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_stream_data * JX9StreamDataInit(jx9_vm *pVm,int iType)

{
  ProcConsumer p_Var1;
  void *pvVar2;
  void *pvVar3;
  jx9_stream_data *pSrc;
  void *pvStack_20;
  
  if ((pVm == (jx9_vm *)0x0) ||
     (pSrc = (jx9_stream_data *)SyMemBackendAlloc(&pVm->sAllocator,0x30),
     pSrc == (jx9_stream_data *)0x0)) {
    return (jx9_stream_data *)0x0;
  }
  SyZero(pSrc,0x30);
  pSrc->iType = iType;
  if (iType == 2) {
    pvStack_20 = (void *)0x1;
  }
  else if (iType == 3) {
    pvStack_20 = (void *)0x2;
  }
  else {
    if (iType == 4) {
      p_Var1 = (pVm->sVmConsumer).xConsumer;
      pvVar2 = (pVm->sVmConsumer).pUserData;
      pvVar3 = (pVm->sVmConsumer).pDefData;
      (pSrc->x).sConsumer.xDef = (pVm->sVmConsumer).xDef;
      (pSrc->x).sConsumer.pDefData = pvVar3;
      (pSrc->x).pHandle = p_Var1;
      (pSrc->x).sConsumer.pUserData = pvVar2;
      goto LAB_00129c1e;
    }
    pvStack_20 = (void *)0x0;
  }
  (pSrc->x).pHandle = pvStack_20;
LAB_00129c1e:
  pSrc->pVm = pVm;
  return pSrc;
}

Assistant:

static jx9_stream_data * JX9StreamDataInit(jx9_vm *pVm, int iType)
{
	jx9_stream_data *pData;
	if( pVm == 0 ){
		return 0;
	}
	/* Allocate a new instance */
	pData = (jx9_stream_data *)SyMemBackendAlloc(&pVm->sAllocator, sizeof(jx9_stream_data));
	if( pData == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pData, sizeof(jx9_stream_data));
	/* Initialize fields */
	pData->iType = iType;
	if( iType == JX9_IO_STREAM_OUTPUT ){
		/* Point to the default VM consumer routine. */
		pData->x.sConsumer = pVm->sVmConsumer; 
	}else{
#ifdef __WINNT__
		DWORD nChannel;
		switch(iType){
		case JX9_IO_STREAM_STDOUT:	nChannel = STD_OUTPUT_HANDLE; break;
		case JX9_IO_STREAM_STDERR:  nChannel = STD_ERROR_HANDLE; break;
		default:
			nChannel = STD_INPUT_HANDLE; 
			break;
		}
		pData->x.pHandle = GetStdHandle(nChannel);
#else
		/* Assume an UNIX system */
		int ifd = STDIN_FILENO;
		switch(iType){
		case JX9_IO_STREAM_STDOUT:  ifd = STDOUT_FILENO; break;
		case JX9_IO_STREAM_STDERR:  ifd = STDERR_FILENO; break;
		default:
			break;
		}
		pData->x.pHandle = SX_INT_TO_PTR(ifd);
#endif
	}
	pData->pVm = pVm;
	return pData;
}